

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall
cmake::Workflow(cmake *this,string *presetName,WorkflowListPresets listPresets,WorkflowFresh fresh)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  bool bVar1;
  bool bVar2;
  string *psVar3;
  pointer ppVar4;
  WorkflowPreset *pWVar5;
  size_type sVar6;
  reference step_00;
  ConfigurePreset *pCVar7;
  reference pCVar8;
  ostream *poVar9;
  basic_ostream<char,_std::char_traits<char>_> *pbVar10;
  static_string_view type;
  string_view sVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_848;
  CalculatedStep *step_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<CalculatedStep,_std::allocator<CalculatedStep>_> *__range1_1;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_763;
  undefined1 local_762;
  bool first;
  int stepResult;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  string local_738 [32];
  string local_718 [32];
  iterator local_6f8;
  size_type local_6f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6e8;
  function<int_()> local_6d0;
  string_view local_6b0;
  string_view local_6a0;
  PackagePreset *local_690;
  PackagePreset *packagePreset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  string local_658 [32];
  string local_638 [32];
  iterator local_618;
  size_type local_610;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_608;
  function<int_()> local_5f0;
  string_view local_5d0;
  string_view local_5c0;
  TestPreset *local_5b0;
  TestPreset *testPreset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  string local_578 [32];
  string local_558 [32];
  string local_538 [32];
  iterator local_518;
  size_type local_510;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_508;
  function<int_()> local_4f0;
  string_view local_4d0;
  string_view local_4c0;
  BuildPreset *local_4b0;
  BuildPreset *buildPreset;
  string_view local_488;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_473;
  undefined1 local_472;
  allocator<char> local_471;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  string local_448 [32];
  string local_428 [32];
  iterator local_408;
  size_type local_400;
  undefined1 local_3f8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  ConfigurePreset *configurePreset;
  WorkflowStep *step;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
  *__range1;
  undefined1 local_3a0 [4];
  int stepNumber;
  vector<CalculatedStep,_std::allocator<CalculatedStep>_> steps;
  string local_380;
  string local_360;
  optional<cmCMakePresetsGraph::WorkflowPreset> *local_340;
  optional<cmCMakePresetsGraph::WorkflowPreset> *expandedPreset;
  string local_330;
  char local_309;
  string local_308;
  _Self local_2e8;
  _Self local_2e0;
  iterator presetPair;
  string local_2d0;
  string local_2b0;
  undefined1 local_289;
  undefined1 local_288 [7];
  bool result;
  cmCMakePresetsGraph settingsFile;
  string local_48;
  WorkflowFresh local_28;
  WorkflowListPresets local_24;
  WorkflowFresh fresh_local;
  WorkflowListPresets listPresets_local;
  string *presetName_local;
  cmake *this_local;
  
  local_28 = fresh;
  local_24 = listPresets;
  _fresh_local = presetName;
  presetName_local = (string *)this;
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  SetHomeDirectory(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  SetHomeOutputDirectory
            (this,(string *)
                  &settingsFile.Files.
                   super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &settingsFile.Files.
              super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmCMakePresetsGraph::cmCMakePresetsGraph((cmCMakePresetsGraph *)local_288);
  psVar3 = GetHomeDirectory_abi_cxx11_(this);
  local_289 = cmCMakePresetsGraph::ReadProjectPresets((cmCMakePresetsGraph *)local_288,psVar3,false)
  ;
  if ((bool)local_289) {
    if (local_24 == Yes) {
      cmCMakePresetsGraph::PrintWorkflowPresetList
                ((cmCMakePresetsGraph *)local_288,(PrintPrecedingNewline *)0x0);
      this_local._4_4_ = 0;
      presetPair._M_node._4_4_ = 1;
    }
    else {
      local_2e0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
                   *)&settingsFile.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  _fresh_local);
      local_2e8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
                  *)&settingsFile.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      bVar1 = std::operator==(&local_2e0,&local_2e8);
      if (bVar1) {
        psVar3 = GetHomeDirectory_abi_cxx11_(this);
        local_309 = '\"';
        cmStrCat<char_const(&)[28],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>
                  (&local_308,(char (*) [28])"No such workflow preset in ",psVar3,
                   (char (*) [4])0x107e0d1,_fresh_local,&local_309);
        cmSystemTools::Error(&local_308);
        std::__cxx11::string::~string((string *)&local_308);
        cmCMakePresetsGraph::PrintWorkflowPresetList
                  ((cmCMakePresetsGraph *)local_288,(PrintPrecedingNewline *)0x0);
        this_local._4_4_ = 1;
        presetPair._M_node._4_4_ = 1;
      }
      else {
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>
                 ::operator->(&local_2e0);
        if (((ppVar4->second).Unexpanded.super_Preset.Hidden & 1U) == 0) {
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>
                   ::operator->(&local_2e0);
          local_340 = &(ppVar4->second).Expanded;
          bVar1 = std::optional::operator_cast_to_bool((optional *)local_340);
          if (bVar1) {
            pWVar5 = std::optional<cmCMakePresetsGraph::WorkflowPreset>::operator->(local_340);
            if (((pWVar5->super_Preset).ConditionResult & 1U) == 0) {
              psVar3 = GetHomeDirectory_abi_cxx11_(this);
              steps.super__Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._7_1_ = 0x22;
              cmStrCat<char_const(&)[40],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>
                        (&local_380,(char (*) [40])"Cannot use disabled workflow preset in ",psVar3,
                         (char (*) [4])0x107e0d1,_fresh_local,
                         (char *)((long)&steps.
                                         super__Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              cmSystemTools::Error(&local_380);
              std::__cxx11::string::~string((string *)&local_380);
              cmCMakePresetsGraph::PrintWorkflowPresetList
                        ((cmCMakePresetsGraph *)local_288,(PrintPrecedingNewline *)0x0);
              this_local._4_4_ = 1;
              presetPair._M_node._4_4_ = 1;
            }
            else {
              std::vector<CalculatedStep,_std::allocator<CalculatedStep>_>::vector
                        ((vector<CalculatedStep,_std::allocator<CalculatedStep>_> *)local_3a0);
              pWVar5 = std::optional<cmCMakePresetsGraph::WorkflowPreset>::operator->(local_340);
              sVar6 = std::
                      vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
                      ::size(&pWVar5->Steps);
              std::vector<CalculatedStep,_std::allocator<CalculatedStep>_>::reserve
                        ((vector<CalculatedStep,_std::allocator<CalculatedStep>_> *)local_3a0,sVar6)
              ;
              __range1._4_4_ = 1;
              pWVar5 = std::optional<cmCMakePresetsGraph::WorkflowPreset>::operator->(local_340);
              __end1 = std::
                       vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
                       ::begin(&pWVar5->Steps);
              step = (WorkflowStep *)
                     std::
                     vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
                     ::end(&pWVar5->Steps);
              while( true ) {
                bVar1 = __gnu_cxx::operator!=
                                  (&__end1,(__normal_iterator<const_cmCMakePresetsGraph::WorkflowPreset::WorkflowStep_*,_std::vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>_>
                                            *)&step);
                if (!bVar1) break;
                step_00 = __gnu_cxx::
                          __normal_iterator<const_cmCMakePresetsGraph::WorkflowPreset::WorkflowStep_*,_std::vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>_>
                          ::operator*(&__end1);
                switch(step_00->PresetType) {
                case Configure:
                  type = ::cm::operator____s("configure",9);
                  args.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)type.super_string_view._M_len;
                  pCVar7 = FindPresetForWorkflow<cmCMakePresetsGraph::ConfigurePreset>
                                     (this,type,
                                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                                       *)((long)&settingsFile.parseState.doc.field_2 + 8),step_00);
                  if (pCVar7 == (ConfigurePreset *)0x0) {
                    this_local._4_4_ = 1;
                    goto LAB_004f1d0d;
                  }
                  local_472 = 1;
                  local_470 = &local_468;
                  psVar3 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
                  std::__cxx11::string::string((string *)&local_468,(string *)psVar3);
                  local_470 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_448;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_448,"--preset",&local_471);
                  local_470 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_428;
                  std::__cxx11::string::string((string *)local_470,(string *)&step_00->PresetName);
                  local_472 = 0;
                  local_408 = &local_468;
                  local_400 = 3;
                  std::
                  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::allocator(&local_473);
                  __l_02._M_len = local_400;
                  __l_02._M_array = local_408;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_3f8,__l_02,&local_473);
                  std::
                  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~allocator(&local_473);
                  local_848 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_408;
                  do {
                    local_848 = local_848 + -1;
                    std::__cxx11::string::~string((string *)local_848);
                  } while (local_848 != &local_468);
                  std::allocator<char>::~allocator(&local_471);
                  if (local_28 == Yes) {
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<char_const(&)[8]>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               local_3f8,(char (*) [8])"--fresh");
                  }
                  sVar11 = (string_view)::cm::operator____s("configure",9);
                  local_488 = sVar11;
                  BuildWorkflowStep((function<int_()> *)&buildPreset,this,
                                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_3f8);
                  std::
                  vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                  ::
                  emplace_back<int&,cm::static_string_view,std::__cxx11::string_const&,std::function<int()>>
                            ((vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                              *)local_3a0,(int *)((long)&__range1 + 4),
                             (static_string_view *)&local_488,&step_00->PresetName,
                             (function<int_()> *)&buildPreset);
                  std::function<int_()>::~function((function<int_()> *)&buildPreset);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_3f8);
                  break;
                case Build:
                  sVar11 = (string_view)::cm::operator____s("build",5);
                  local_4c0 = sVar11;
                  local_4b0 = FindPresetForWorkflow<cmCMakePresetsGraph::BuildPreset>
                                        (this,(static_string_view)sVar11,
                                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
                                          *)&settingsFile.ConfigurePresets._M_t._M_impl.
                                             super__Rb_tree_header._M_node_count,step_00);
                  if (local_4b0 == (BuildPreset *)0x0) {
                    this_local._4_4_ = 1;
                    goto LAB_004f1d0d;
                  }
                  sVar11 = (string_view)::cm::operator____s("build",5);
                  testPreset._5_1_ = 1;
                  local_5a0 = &local_598;
                  local_4d0 = sVar11;
                  psVar3 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
                  std::__cxx11::string::string((string *)&local_598,(string *)psVar3);
                  local_5a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_578;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_578,"--build",(allocator<char> *)((long)&testPreset + 7));
                  local_5a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_558;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_558,"--preset",(allocator<char> *)((long)&testPreset + 6));
                  local_5a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_538;
                  std::__cxx11::string::string((string *)local_5a0,(string *)&step_00->PresetName);
                  testPreset._5_1_ = 0;
                  local_518 = &local_598;
                  local_510 = 4;
                  std::
                  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)((long)&testPreset + 4));
                  __l_01._M_len = local_510;
                  __l_01._M_array = local_518;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_508,__l_01,
                           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)((long)&testPreset + 4));
                  BuildWorkflowStep(&local_4f0,this,&local_508);
                  std::
                  vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                  ::
                  emplace_back<int&,cm::static_string_view,std::__cxx11::string_const&,std::function<int()>>
                            ((vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                              *)local_3a0,(int *)((long)&__range1 + 4),
                             (static_string_view *)&local_4d0,&step_00->PresetName,&local_4f0);
                  std::function<int_()>::~function(&local_4f0);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_508);
                  std::
                  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)((long)&testPreset + 4));
                  local_900 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_518;
                  do {
                    local_900 = local_900 + -1;
                    std::__cxx11::string::~string((string *)local_900);
                  } while (local_900 != &local_598);
                  std::allocator<char>::~allocator((allocator<char> *)((long)&testPreset + 6));
                  std::allocator<char>::~allocator((allocator<char> *)((long)&testPreset + 7));
                  break;
                case Test:
                  sVar11 = (string_view)::cm::operator____s("test",4);
                  local_5c0 = sVar11;
                  local_5b0 = FindPresetForWorkflow<cmCMakePresetsGraph::TestPreset>
                                        (this,(static_string_view)sVar11,
                                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
                                          *)&settingsFile.BuildPresets._M_t._M_impl.
                                             super__Rb_tree_header._M_node_count,step_00);
                  if (local_5b0 == (TestPreset *)0x0) {
                    this_local._4_4_ = 1;
                    goto LAB_004f1d0d;
                  }
                  sVar11 = (string_view)::cm::operator____s("test",4);
                  packagePreset._6_1_ = 1;
                  local_680 = &local_678;
                  local_5d0 = sVar11;
                  psVar3 = cmSystemTools::GetCTestCommand_abi_cxx11_();
                  std::__cxx11::string::string((string *)&local_678,(string *)psVar3);
                  local_680 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_658;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_658,"--preset",(allocator<char> *)((long)&packagePreset + 7));
                  local_680 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_638;
                  std::__cxx11::string::string((string *)local_680,(string *)&step_00->PresetName);
                  packagePreset._6_1_ = 0;
                  local_618 = &local_678;
                  local_610 = 3;
                  std::
                  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)((long)&packagePreset + 5));
                  __l_00._M_len = local_610;
                  __l_00._M_array = local_618;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_608,__l_00,
                           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)((long)&packagePreset + 5));
                  BuildWorkflowStep(&local_5f0,this,&local_608);
                  std::
                  vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                  ::
                  emplace_back<int&,cm::static_string_view,std::__cxx11::string_const&,std::function<int()>>
                            ((vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                              *)local_3a0,(int *)((long)&__range1 + 4),
                             (static_string_view *)&local_5d0,&step_00->PresetName,&local_5f0);
                  std::function<int_()>::~function(&local_5f0);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_608);
                  std::
                  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)((long)&packagePreset + 5));
                  local_990 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_618;
                  do {
                    local_990 = local_990 + -1;
                    std::__cxx11::string::~string((string *)local_990);
                  } while (local_990 != &local_678);
                  std::allocator<char>::~allocator((allocator<char> *)((long)&packagePreset + 7));
                  break;
                case Package:
                  sVar11 = (string_view)::cm::operator____s("package",7);
                  local_6a0 = sVar11;
                  local_690 = FindPresetForWorkflow<cmCMakePresetsGraph::PackagePreset>
                                        (this,(static_string_view)sVar11,
                                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
                                          *)&settingsFile.TestPresets._M_t._M_impl.
                                             super__Rb_tree_header._M_node_count,step_00);
                  if (local_690 == (PackagePreset *)0x0) {
                    this_local._4_4_ = 1;
                    goto LAB_004f1d0d;
                  }
                  sVar11 = (string_view)::cm::operator____s("package",7);
                  local_762 = 1;
                  _stepResult = &local_758;
                  local_6b0 = sVar11;
                  psVar3 = cmSystemTools::GetCPackCommand_abi_cxx11_();
                  std::__cxx11::string::string((string *)&local_758,(string *)psVar3);
                  _stepResult = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_738;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_738,"--preset",(allocator<char> *)&first);
                  _stepResult = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_718;
                  std::__cxx11::string::string((string *)_stepResult,(string *)&step_00->PresetName)
                  ;
                  local_762 = 0;
                  local_6f8 = &local_758;
                  local_6f0 = 3;
                  std::
                  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::allocator(&local_763);
                  __l._M_len = local_6f0;
                  __l._M_array = local_6f8;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_6e8,__l,&local_763);
                  BuildWorkflowStep(&local_6d0,this,&local_6e8);
                  std::
                  vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                  ::
                  emplace_back<int&,cm::static_string_view,std::__cxx11::string_const&,std::function<int()>>
                            ((vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                              *)local_3a0,(int *)((long)&__range1 + 4),
                             (static_string_view *)&local_6b0,&step_00->PresetName,&local_6d0);
                  std::function<int_()>::~function(&local_6d0);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_6e8);
                  std::
                  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~allocator(&local_763);
                  local_a20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_6f8;
                  do {
                    local_a20 = local_a20 + -1;
                    std::__cxx11::string::~string((string *)local_a20);
                  } while (local_a20 != &local_758);
                  std::allocator<char>::~allocator((allocator<char> *)&first);
                }
                __range1._4_4_ = __range1._4_4_ + 1;
                __gnu_cxx::
                __normal_iterator<const_cmCMakePresetsGraph::WorkflowPreset::WorkflowStep_*,_std::vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>_>
                ::operator++(&__end1);
              }
              bVar1 = true;
              __end1_1 = std::vector<CalculatedStep,_std::allocator<CalculatedStep>_>::begin
                                   ((vector<CalculatedStep,_std::allocator<CalculatedStep>_> *)
                                    local_3a0);
              step_1 = (CalculatedStep *)
                       std::vector<CalculatedStep,_std::allocator<CalculatedStep>_>::end
                                 ((vector<CalculatedStep,_std::allocator<CalculatedStep>_> *)
                                  local_3a0);
              while( true ) {
                bVar2 = __gnu_cxx::operator!=
                                  (&__end1_1,
                                   (__normal_iterator<CalculatedStep_*,_std::vector<CalculatedStep,_std::allocator<CalculatedStep>_>_>
                                    *)&step_1);
                if (!bVar2) break;
                pCVar8 = __gnu_cxx::
                         __normal_iterator<CalculatedStep_*,_std::vector<CalculatedStep,_std::allocator<CalculatedStep>_>_>
                         ::operator*(&__end1_1);
                if (!bVar1) {
                  std::operator<<((ostream *)&std::cout,"\n");
                }
                poVar9 = std::operator<<((ostream *)&std::cout,"Executing workflow step ");
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,pCVar8->StepNumber);
                poVar9 = std::operator<<(poVar9," of ");
                sVar6 = std::vector<CalculatedStep,_std::allocator<CalculatedStep>_>::size
                                  ((vector<CalculatedStep,_std::allocator<CalculatedStep>_> *)
                                   local_3a0);
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar6);
                poVar9 = std::operator<<(poVar9,": ");
                pbVar10 = std::operator<<(poVar9,(pCVar8->Type).super_string_view);
                poVar9 = std::operator<<(pbVar10," preset \"");
                poVar9 = std::operator<<(poVar9,(string *)&pCVar8->Name);
                poVar9 = std::operator<<(poVar9,"\"\n\n");
                std::ostream::operator<<(poVar9,std::flush<char,std::char_traits<char>>);
                this_local._4_4_ = std::function<int_()>::operator()(&pCVar8->Action);
                if (this_local._4_4_ != 0) goto LAB_004f1d0d;
                bVar1 = false;
                __gnu_cxx::
                __normal_iterator<CalculatedStep_*,_std::vector<CalculatedStep,_std::allocator<CalculatedStep>_>_>
                ::operator++(&__end1_1);
              }
              this_local._4_4_ = 0;
LAB_004f1d0d:
              presetPair._M_node._4_4_ = 1;
              std::vector<CalculatedStep,_std::allocator<CalculatedStep>_>::~vector
                        ((vector<CalculatedStep,_std::allocator<CalculatedStep>_> *)local_3a0);
            }
          }
          else {
            cmStrCat<char_const(&)[37],std::__cxx11::string_const&,char_const(&)[27]>
                      (&local_360,(char (*) [37])"Could not evaluate workflow preset \"",
                       _fresh_local,(char (*) [27])"\": Invalid macro expansion");
            cmSystemTools::Error(&local_360);
            std::__cxx11::string::~string((string *)&local_360);
            cmCMakePresetsGraph::PrintWorkflowPresetList
                      ((cmCMakePresetsGraph *)local_288,(PrintPrecedingNewline *)0x0);
            this_local._4_4_ = 1;
            presetPair._M_node._4_4_ = 1;
          }
        }
        else {
          psVar3 = GetHomeDirectory_abi_cxx11_(this);
          expandedPreset._7_1_ = 0x22;
          cmStrCat<char_const(&)[38],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>
                    (&local_330,(char (*) [38])"Cannot use hidden workflow preset in ",psVar3,
                     (char (*) [4])0x107e0d1,_fresh_local,(char *)((long)&expandedPreset + 7));
          cmSystemTools::Error(&local_330);
          std::__cxx11::string::~string((string *)&local_330);
          cmCMakePresetsGraph::PrintWorkflowPresetList
                    ((cmCMakePresetsGraph *)local_288,(PrintPrecedingNewline *)0x0);
          this_local._4_4_ = 1;
          presetPair._M_node._4_4_ = 1;
        }
      }
    }
  }
  else {
    psVar3 = GetHomeDirectory_abi_cxx11_(this);
    cmJSONState::GetErrorMessage_abi_cxx11_
              (&local_2d0,(cmJSONState *)((long)&settingsFile.errors.field_2 + 8),true);
    cmStrCat<char_const(&)[29],std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string>
              (&local_2b0,(char (*) [29])"Could not read presets from ",psVar3,
               (char (*) [2])0x1074b0c,&local_2d0);
    cmSystemTools::Error(&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2d0);
    this_local._4_4_ = 1;
    presetPair._M_node._4_4_ = 1;
  }
  cmCMakePresetsGraph::~cmCMakePresetsGraph((cmCMakePresetsGraph *)local_288);
  return this_local._4_4_;
}

Assistant:

int cmake::Workflow(const std::string& presetName,
                    WorkflowListPresets listPresets, WorkflowFresh fresh)
{
#ifndef CMAKE_BOOTSTRAP
  this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
  this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());

  cmCMakePresetsGraph settingsFile;
  auto result = settingsFile.ReadProjectPresets(this->GetHomeDirectory());
  if (result != true) {
    cmSystemTools::Error(cmStrCat("Could not read presets from ",
                                  this->GetHomeDirectory(), ":",
                                  settingsFile.parseState.GetErrorMessage()));
    return 1;
  }

  if (listPresets == WorkflowListPresets::Yes) {
    settingsFile.PrintWorkflowPresetList();
    return 0;
  }

  auto presetPair = settingsFile.WorkflowPresets.find(presetName);
  if (presetPair == settingsFile.WorkflowPresets.end()) {
    cmSystemTools::Error(cmStrCat("No such workflow preset in ",
                                  this->GetHomeDirectory(), ": \"", presetName,
                                  '"'));
    settingsFile.PrintWorkflowPresetList();
    return 1;
  }

  if (presetPair->second.Unexpanded.Hidden) {
    cmSystemTools::Error(cmStrCat("Cannot use hidden workflow preset in ",
                                  this->GetHomeDirectory(), ": \"", presetName,
                                  '"'));
    settingsFile.PrintWorkflowPresetList();
    return 1;
  }

  auto const& expandedPreset = presetPair->second.Expanded;
  if (!expandedPreset) {
    cmSystemTools::Error(cmStrCat("Could not evaluate workflow preset \"",
                                  presetName, "\": Invalid macro expansion"));
    settingsFile.PrintWorkflowPresetList();
    return 1;
  }

  if (!expandedPreset->ConditionResult) {
    cmSystemTools::Error(cmStrCat("Cannot use disabled workflow preset in ",
                                  this->GetHomeDirectory(), ": \"", presetName,
                                  '"'));
    settingsFile.PrintWorkflowPresetList();
    return 1;
  }

  struct CalculatedStep
  {
    int StepNumber;
    cm::static_string_view Type;
    std::string Name;
    std::function<int()> Action;

    CalculatedStep(int stepNumber, cm::static_string_view type,
                   std::string name, std::function<int()> action)
      : StepNumber(stepNumber)
      , Type(type)
      , Name(std::move(name))
      , Action(std::move(action))
    {
    }
  };

  std::vector<CalculatedStep> steps;
  steps.reserve(expandedPreset->Steps.size());
  int stepNumber = 1;
  for (auto const& step : expandedPreset->Steps) {
    switch (step.PresetType) {
      case cmCMakePresetsGraph::WorkflowPreset::WorkflowStep::Type::
        Configure: {
        auto const* configurePreset = this->FindPresetForWorkflow(
          "configure"_s, settingsFile.ConfigurePresets, step);
        if (!configurePreset) {
          return 1;
        }
        std::vector<std::string> args{ cmSystemTools::GetCMakeCommand(),
                                       "--preset", step.PresetName };
        if (fresh == WorkflowFresh::Yes) {
          args.emplace_back("--fresh");
        }
        steps.emplace_back(stepNumber, "configure"_s, step.PresetName,
                           this->BuildWorkflowStep(args));
      } break;
      case cmCMakePresetsGraph::WorkflowPreset::WorkflowStep::Type::Build: {
        auto const* buildPreset = this->FindPresetForWorkflow(
          "build"_s, settingsFile.BuildPresets, step);
        if (!buildPreset) {
          return 1;
        }
        steps.emplace_back(
          stepNumber, "build"_s, step.PresetName,
          this->BuildWorkflowStep({ cmSystemTools::GetCMakeCommand(),
                                    "--build", "--preset", step.PresetName }));
      } break;
      case cmCMakePresetsGraph::WorkflowPreset::WorkflowStep::Type::Test: {
        auto const* testPreset = this->FindPresetForWorkflow(
          "test"_s, settingsFile.TestPresets, step);
        if (!testPreset) {
          return 1;
        }
        steps.emplace_back(
          stepNumber, "test"_s, step.PresetName,
          this->BuildWorkflowStep({ cmSystemTools::GetCTestCommand(),
                                    "--preset", step.PresetName }));
      } break;
      case cmCMakePresetsGraph::WorkflowPreset::WorkflowStep::Type::Package: {
        auto const* packagePreset = this->FindPresetForWorkflow(
          "package"_s, settingsFile.PackagePresets, step);
        if (!packagePreset) {
          return 1;
        }
        steps.emplace_back(
          stepNumber, "package"_s, step.PresetName,
          this->BuildWorkflowStep({ cmSystemTools::GetCPackCommand(),
                                    "--preset", step.PresetName }));
      } break;
    }
    stepNumber++;
  }

  int stepResult;
  bool first = true;
  for (auto const& step : steps) {
    if (!first) {
      std::cout << "\n";
    }
    std::cout << "Executing workflow step " << step.StepNumber << " of "
              << steps.size() << ": " << step.Type << " preset \"" << step.Name
              << "\"\n\n"
              << std::flush;
    if ((stepResult = step.Action()) != 0) {
      return stepResult;
    }
    first = false;
  }
#endif

  return 0;
}